

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall
QMdiSubWindowPrivate::setEnabled(QMdiSubWindowPrivate *this,WindowStateAction action,bool enable)

{
  Data *pDVar1;
  
  pDVar1 = this->actions[action].wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (this->actions[action].wp.value != (QObject *)0x0)) {
    QAction::setEnabled(SUB81(this->actions[action].wp.value,0));
    return;
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::setEnabled(WindowStateAction action, bool enable)
{
    if (actions[action])
        actions[action]->setEnabled(enable);
}